

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall Rml::ElementDocument::UpdateDocument(ElementDocument *this)

{
  float local_3c;
  Vector2i local_24;
  Vector2f local_1c;
  Vector2f vp_dimensions;
  float dp_ratio;
  ElementDocument *this_local;
  
  unique0x100000d7 = this;
  if (this->context == (Context *)0x0) {
    local_3c = 1.0;
  }
  else {
    local_3c = Context::GetDensityIndependentPixelRatio(this->context);
  }
  vp_dimensions.x = local_3c;
  if (this->context == (Context *)0x0) {
    Vector2<float>::Vector2(&local_1c,1.0);
  }
  else {
    local_24 = Context::GetDimensions(this->context);
    local_1c = Vector2::operator_cast_to_Vector2((Vector2 *)&local_24);
  }
  Element::Update(&this->super_Element,vp_dimensions.x,local_1c);
  UpdateLayout(this);
  UpdatePosition(this);
  return;
}

Assistant:

void ElementDocument::UpdateDocument()
{
	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));
	Update(dp_ratio, vp_dimensions);
	UpdateLayout();
	UpdatePosition();
}